

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O0

void ncnn::embed(Mat *bottom_blob,Mat *weight_data,Mat *bias_data,Mat *top_blob,int input_dim,
                Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *__dest;
  void *__src;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int p;
  float *em;
  int word_index;
  float *outptr;
  int q;
  float *bias_ptr;
  int words;
  int num_output;
  int local_8c;
  int local_7c;
  int local_6c;
  
  iVar1 = *(int *)((long)in_RCX + 0x2c);
  lVar3 = in_RCX[6];
  lVar2 = *in_RDX;
  for (local_6c = 0; local_6c < (int)lVar3; local_6c = local_6c + 1) {
    __dest = (void *)(*in_RCX + (long)*(int *)((long)in_RCX + 0x2c) * (long)local_6c * in_RCX[2]);
    local_7c = *(int *)(*in_RDI + (long)local_6c * 4);
    if (local_7c < 0) {
      local_7c = 0;
    }
    if (in_R8D <= local_7c) {
      local_7c = in_R8D + -1;
    }
    __src = (void *)(*in_RSI + (long)(iVar1 * local_7c) * 4);
    if (lVar2 == 0) {
      memcpy(__dest,__src,(long)iVar1 << 2);
    }
    else {
      for (local_8c = 0; local_8c < iVar1; local_8c = local_8c + 1) {
        *(float *)((long)__dest + (long)local_8c * 4) =
             *(float *)((long)__src + (long)local_8c * 4) + *(float *)(lVar2 + (long)local_8c * 4);
      }
    }
  }
  return;
}

Assistant:

static void embed(const Mat& bottom_blob, const Mat& weight_data, const Mat& bias_data, Mat& top_blob, int input_dim, const Option& opt)
{
    const int num_output = top_blob.w;
    const int words = top_blob.h;

    const float* bias_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < words; q++)
    {
        float* outptr = top_blob.row(q);

        int word_index = ((const int*)bottom_blob)[q];

        if (word_index < 0)
            word_index = 0;
        if (word_index >= input_dim)
            word_index = input_dim - 1;

        const float* em = (const float*)weight_data + num_output * word_index;

        if (bias_ptr)
        {
            for (int p = 0; p < num_output; p++)
            {
                outptr[p] = em[p] + bias_ptr[p];
            }
        }
        else
        {
            memcpy(outptr, em, num_output * sizeof(float));
        }
    }
}